

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorFactory.cpp
# Opt level: O2

shared_ptr<adios2::core::Operator> adios2::core::MakeOperator(string *type,Params *parameters)

{
  bool bVar1;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<adios2::core::Operator> sVar2;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  undefined1 local_d0 [32];
  string typeLowerCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  
  (type->_M_dataplus)._M_p = (pointer)0x0;
  type->_M_string_length = 0;
  helper::LowerCase<std::__cxx11::string>(&typeLowerCase,(helper *)parameters,in_RDX);
  bVar1 = std::operator==(&typeLowerCase,"bigwhoop");
  if (!bVar1) {
    bVar1 = std::operator==(&typeLowerCase,"blosc");
    if (!bVar1) {
      bVar1 = std::operator==(&typeLowerCase,"bzip2");
      if (!bVar1) {
        bVar1 = std::operator==(&typeLowerCase,"libpressio");
        if (!bVar1) {
          bVar1 = std::operator==(&typeLowerCase,"mgard");
          if (!bVar1) {
            bVar1 = std::operator==(&typeLowerCase,"mgardplus");
            if (!bVar1) {
              bVar1 = std::operator==(&typeLowerCase,"png");
              if (bVar1) {
                std::
                make_shared<adios2::core::compress::CompressPNG,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                          ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d0);
                std::__shared_ptr<adios2::core::Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<adios2::core::Operator,(__gnu_cxx::_Lock_policy)2> *)type,
                           (__shared_ptr<adios2::core::compress::CompressPNG,_(__gnu_cxx::_Lock_policy)2>
                            *)local_d0);
              }
              else {
                bVar1 = std::operator==(&typeLowerCase,"sirius");
                if (bVar1) {
                  std::
                  make_shared<adios2::core::compress::CompressSirius,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_d0);
                  std::__shared_ptr<adios2::core::Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_ptr<adios2::core::Operator,(__gnu_cxx::_Lock_policy)2> *)type
                             ,(__shared_ptr<adios2::core::compress::CompressSirius,_(__gnu_cxx::_Lock_policy)2>
                               *)local_d0);
                }
                else {
                  bVar1 = std::operator==(&typeLowerCase,"sz");
                  if (bVar1) goto LAB_0045d3c3;
                  bVar1 = std::operator==(&typeLowerCase,"zfp");
                  if (bVar1) goto LAB_0045d3c3;
                  bVar1 = std::operator==(&typeLowerCase,"mdr");
                  if (bVar1) goto LAB_0045d3c3;
                  bVar1 = std::operator==(&typeLowerCase,"plugin");
                  if (bVar1) {
                    std::
                    make_shared<adios2::plugin::PluginOperator,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d0);
                    std::__shared_ptr<adios2::core::Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                              ((__shared_ptr<adios2::core::Operator,(__gnu_cxx::_Lock_policy)2> *)
                               type,(__shared_ptr<adios2::plugin::PluginOperator,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_d0);
                  }
                  else {
                    bVar1 = std::operator==(&typeLowerCase,"null");
                    if (!bVar1) {
                      std::__cxx11::string::string((string *)local_d0,"Operator",&local_d1);
                      std::__cxx11::string::string((string *)&local_30,"OperatorFactory",&local_d2);
                      std::__cxx11::string::string((string *)&local_50,"MakeOperator",&local_d3);
                      std::operator+(&local_90,"ADIOS2 does not support ",&typeLowerCase);
                      std::operator+(&local_70,&local_90," operation");
                      helper::Throw<std::invalid_argument>
                                ((string *)local_d0,&local_30,&local_50,&local_70,-1);
                      std::__cxx11::string::~string((string *)&local_70);
                      std::__cxx11::string::~string((string *)&local_90);
                      std::__cxx11::string::~string((string *)&local_50);
                      std::__cxx11::string::~string((string *)&local_30);
                      std::__cxx11::string::~string((string *)local_d0);
                      goto LAB_0045d3c3;
                    }
                    std::
                    make_shared<adios2::core::compress::CompressNull,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d0);
                    std::__shared_ptr<adios2::core::Operator,(__gnu_cxx::_Lock_policy)2>::operator=
                              ((__shared_ptr<adios2::core::Operator,(__gnu_cxx::_Lock_policy)2> *)
                               type,(__shared_ptr<adios2::core::compress::CompressNull,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_d0);
                  }
                }
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
            }
          }
        }
      }
    }
  }
LAB_0045d3c3:
  if ((type->_M_dataplus)._M_p == (pointer)0x0) {
    std::__cxx11::string::string((string *)local_d0,"Operator",&local_d1);
    std::__cxx11::string::string((string *)&local_30,"OperatorFactory",&local_d2);
    std::__cxx11::string::string((string *)&local_50,"MakeOperator",&local_d3);
    std::operator+(&local_90,"ADIOS2 didn\'t compile with ",&typeLowerCase);
    std::operator+(&local_70,&local_90," library, operator not added");
    helper::Throw<std::invalid_argument>((string *)local_d0,&local_30,&local_50,&local_70,-1);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::__cxx11::string::~string((string *)&typeLowerCase);
  sVar2.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)type;
  return (shared_ptr<adios2::core::Operator>)
         sVar2.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Operator> MakeOperator(const std::string &type, const Params &parameters)
{
    std::shared_ptr<Operator> ret = nullptr;

    const std::string typeLowerCase = helper::LowerCase(type);

    if (typeLowerCase == "bigwhoop")
    {
#ifdef ADIOS2_HAVE_BIGWHOOP
        ret = std::make_shared<compress::CompressBigWhoop>(parameters);
#endif
    }
    else if (typeLowerCase == "blosc")
    {
#ifdef ADIOS2_HAVE_BLOSC2
        ret = std::make_shared<compress::CompressBlosc>(parameters);
#endif
    }
    else if (typeLowerCase == "bzip2")
    {
#ifdef ADIOS2_HAVE_BZIP2
        ret = std::make_shared<compress::CompressBZIP2>(parameters);
#endif
    }
    else if (typeLowerCase == "libpressio")
    {
#ifdef ADIOS2_HAVE_LIBPRESSIO
        ret = std::make_shared<compress::CompressLibPressio>(parameters);
#endif
    }
    else if (typeLowerCase == "mgard")
    {
#ifdef ADIOS2_HAVE_MGARD
        ret = std::make_shared<compress::CompressMGARD>(parameters);
#endif
    }
    else if (typeLowerCase == "mgardplus")
    {
#ifdef ADIOS2_HAVE_MGARD
        ret = std::make_shared<compress::CompressMGARDPlus>(parameters);
#endif
    }
    else if (typeLowerCase == "png")
    {
#ifdef ADIOS2_HAVE_PNG
        ret = std::make_shared<compress::CompressPNG>(parameters);
#endif
    }
    else if (typeLowerCase == "sirius")
    {
#ifdef ADIOS2_HAVE_MHS
        ret = std::make_shared<compress::CompressSirius>(parameters);
#endif
    }
    else if (typeLowerCase == "sz")
    {
#ifdef ADIOS2_HAVE_SZ
        ret = std::make_shared<compress::CompressSZ>(parameters);
#endif
    }
    else if (typeLowerCase == "zfp")
    {
#ifdef ADIOS2_HAVE_ZFP
        ret = std::make_shared<compress::CompressZFP>(parameters);
#endif
    }
    else if (typeLowerCase == "mdr")
    {
#ifdef ADIOS2_HAVE_MGARD_MDR
        ret = std::make_shared<refactor::RefactorMDR>(parameters);
#endif
    }
    else if (typeLowerCase == "plugin")
    {
        ret = std::make_shared<plugin::PluginOperator>(parameters);
    }
    else if (typeLowerCase == "null")
    {
        ret = std::make_shared<compress::CompressNull>(parameters);
    }
    else
    {
        helper::Throw<std::invalid_argument>("Operator", "OperatorFactory", "MakeOperator",
                                             "ADIOS2 does not support " + typeLowerCase +
                                                 " operation");
    }

    if (ret == nullptr)
    {
        helper::Throw<std::invalid_argument>("Operator", "OperatorFactory", "MakeOperator",
                                             "ADIOS2 didn't compile with " + typeLowerCase +
                                                 " library, operator not added");
    }

    return ret;
}